

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

bool __thiscall Rml::Element::Focus(Element *this,bool focus_visible)

{
  Focus FVar1;
  bool bVar2;
  Context *this_00;
  Element *pEVar3;
  Element *parent;
  Element *element;
  Context *context;
  Focus focus_property;
  bool focus_visible_local;
  Element *this_local;
  
  FVar1 = Style::ComputedValues::focus(&this->meta->computed_values);
  if (FVar1 == None) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = GetContext(this);
    if (this_00 == (Context *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = Context::OnFocusChange(this_00,this,focus_visible);
      if (bVar2) {
        this->focus = (Element *)0x0;
        parent = this;
        while( true ) {
          pEVar3 = GetParentNode(parent);
          if (pEVar3 == (Element *)0x0) break;
          pEVar3->focus = parent;
          parent = pEVar3;
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Element::Focus(bool focus_visible)
{
	// Are we allowed focus?
	Style::Focus focus_property = meta->computed_values.focus();
	if (focus_property == Style::Focus::None)
		return false;

	// Ask our context if we can switch focus.
	Context* context = GetContext();
	if (context == nullptr)
		return false;

	if (!context->OnFocusChange(this, focus_visible))
		return false;

	// Set this as the end of the focus chain.
	focus = nullptr;

	// Update the focus chain up the hierarchy.
	Element* element = this;
	while (Element* parent = element->GetParentNode())
	{
		parent->focus = element;
		element = parent;
	}

	return true;
}